

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_vsnprintf_alloc(sx_alloc *alloc,char *fmt,__va_list_tag *args)

{
  sx_alloc *local_238;
  sx__printf_ctx ctx;
  __va_list_tag *args_local;
  char *fmt_local;
  sx_alloc *alloc_local;
  
  ctx.alloc = (sx_alloc *)0x0;
  ctx.buff._0_4_ = 0;
  local_238 = alloc;
  ctx._528_8_ = args;
  stbsp_vsprintfcb(sx__vsnprintf_callback,&local_238,(char *)((long)&ctx.buff + 4),fmt,args);
  *(undefined1 *)((long)&(ctx.alloc)->alloc_cb + (long)(int)ctx.buff) = 0;
  return (char *)ctx.alloc;
}

Assistant:

char* sx_vsnprintf_alloc(const sx_alloc* alloc, const char* fmt, va_list args)
{
    sx__printf_ctx ctx;
    ctx.alloc = alloc;
    ctx.buff = NULL;
    ctx.len = 0;
    stbsp_vsprintfcb(sx__vsnprintf_callback, &ctx, ctx.tmp, fmt, args);
    ctx.buff[ctx.len] = '\0';
    return ctx.buff;
}